

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_gej_zinv(secp256k1_ge *r,secp256k1_gej *a,secp256k1_fe *zi)

{
  secp256k1_ge *a_00;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe sStack_88;
  secp256k1_fe local_58;
  
  secp256k1_gej_verify(a);
  a_00 = (secp256k1_ge *)zi;
  secp256k1_fe_verify(zi);
  if (a->infinity == 0) {
    secp256k1_fe_sqr(&local_58,zi);
    secp256k1_fe_mul(&sStack_88,&local_58,zi);
    secp256k1_fe_mul(&r->x,&a->x,&local_58);
    secp256k1_fe_mul(&r->y,&a->y,&sStack_88);
    r->infinity = a->infinity;
    secp256k1_ge_verify(r);
    return;
  }
  secp256k1_ge_set_gej_zinv_cold_1();
  a_00->infinity = 1;
  (a_00->x).n[0] = 0;
  (a_00->x).n[1] = 0;
  (a_00->x).n[2] = 0;
  (a_00->x).n[3] = 0;
  *(undefined8 *)((long)(a_00->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(a_00->x).n + 0x24) = 0;
  (a_00->x).normalized = 1;
  secp256k1_fe_verify(&a_00->x);
  *(undefined8 *)((long)(a_00->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(a_00->y).n + 0x24) = 0;
  (a_00->y).n[2] = 0;
  (a_00->y).n[3] = 0;
  (a_00->y).n[0] = 0;
  (a_00->y).n[1] = 0;
  (a_00->y).normalized = 1;
  secp256k1_fe_verify(&a_00->y);
  secp256k1_ge_verify(a_00);
  return;
}

Assistant:

static void secp256k1_ge_set_gej_zinv(secp256k1_ge *r, const secp256k1_gej *a, const secp256k1_fe *zi) {
    secp256k1_fe zi2;
    secp256k1_fe zi3;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_FE_VERIFY(zi);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&zi2, zi);
    secp256k1_fe_mul(&zi3, &zi2, zi);
    secp256k1_fe_mul(&r->x, &a->x, &zi2);
    secp256k1_fe_mul(&r->y, &a->y, &zi3);
    r->infinity = a->infinity;

    SECP256K1_GE_VERIFY(r);
}